

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netpong.cpp
# Opt level: O1

void start_game(void)

{
  undefined4 uVar1;
  char cVar2;
  int iVar3;
  uint uVar4;
  Am_Value *pAVar5;
  Am_Object local_28;
  Am_Object local_20;
  Am_Object local_18;
  
  pAVar5 = (Am_Value *)Am_Object::Get(0x82d8,0x66);
  iVar3 = Am_Value::operator_cast_to_int(pAVar5);
  Am_Object::Set(0x82f8,100,(ulong)(uint)((iVar3 - (iVar3 + -0x15 >> 0x1f)) + -0x15 >> 1));
  pAVar5 = (Am_Value *)Am_Object::Get(0x82e0,0x67);
  iVar3 = Am_Value::operator_cast_to_int(pAVar5);
  Am_Object::Set(0x82f8,0x65,(ulong)(uint)((iVar3 - (iVar3 + -0x15 >> 0x1f)) + -0x15 >> 1));
  Am_Object::Set(0x82f8,true,1);
  pAVar5 = (Am_Value *)Am_Object::Get(0x82e0,0x67);
  iVar3 = Am_Value::operator_cast_to_int(pAVar5);
  Am_Object::Set(0x82e8,0x65,(ulong)(uint)((iVar3 - (iVar3 + -0x3c >> 0x1f)) + -0x3c >> 1));
  pAVar5 = (Am_Value *)Am_Object::Get(0x82e0,0x67);
  iVar3 = Am_Value::operator_cast_to_int(pAVar5);
  Am_Object::Set(0x82f0,0x65,(ulong)(uint)((iVar3 - (iVar3 + -0x3c >> 0x1f)) + -0x3c >> 1));
  uVar4 = rand();
  y_offset = (uVar4 & 7) + 1;
  uVar4 = rand();
  if ((uVar4 & 1) != 0) {
    y_offset = -y_offset;
  }
  uVar4 = rand();
  x_offset = (uVar4 & 7) + 1;
  if (player1sturn == true) {
    x_offset = ~(uVar4 & 7);
  }
  cVar2 = Am_Network_Group::Am_Leader();
  if (cVar2 != '\0') {
    Am_Object::Am_Object(&local_18,&anim);
    Am_Object::Am_Object(&local_20,(Am_Object *)&Am_No_Object);
    uVar1 = _Am_Default_Start_Char;
    Am_Object::Am_Object(&local_28,(Am_Object *)&Am_No_Object);
    Am_Start_Interactor(&local_18,&local_20,uVar1,&local_28,0,0,1);
    Am_Object::~Am_Object(&local_28);
    Am_Object::~Am_Object(&local_20);
    Am_Object::~Am_Object(&local_18);
  }
  return;
}

Assistant:

void
start_game(void)
{
  ball.Set(Am_LEFT, (int)((int)window.Get(Am_WIDTH) - ball_size) / 2);
  ball.Set(Am_TOP, (int)((int)main_group.Get(Am_HEIGHT) - ball_size) / 2);
  ball.Set(Am_VISIBLE, true);
  paddle1.Set(Am_TOP,
              (int)((int)main_group.Get(Am_HEIGHT) - paddle_height) / 2);
  paddle2.Set(Am_TOP,
              (int)((int)main_group.Get(Am_HEIGHT) - paddle_height) / 2);
  y_offset = (rand() & 7) + 1;
  if (rand() & 1)
    y_offset = -y_offset;
  x_offset = (rand() & 7) + 1;
  if (player1sturn)
    x_offset = -x_offset;
  if (Am_Network.Am_Leader())
    Am_Start_Interactor(anim);
}